

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesSchedulerSetTimesliceMode
          (zes_sched_handle_t hScheduler,zes_sched_timeslice_properties_t *pProperties,
          ze_bool_t *pNeedReload)

{
  zes_pfnSchedulerSetTimesliceMode_t pfnSetTimesliceMode;
  ze_result_t result;
  ze_bool_t *pNeedReload_local;
  zes_sched_timeslice_properties_t *pProperties_local;
  zes_sched_handle_t hScheduler_local;
  
  pfnSetTimesliceMode._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cba0 != (code *)0x0) {
    pfnSetTimesliceMode._4_4_ = (*DAT_0011cba0)(hScheduler,pProperties,pNeedReload);
  }
  return pfnSetTimesliceMode._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesSchedulerSetTimesliceMode(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        zes_sched_timeslice_properties_t* pProperties,  ///< [in] The properties to use when configurating this mode.
        ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                        ///< apply the new scheduler mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetTimesliceMode = context.zesDdiTable.Scheduler.pfnSetTimesliceMode;
        if( nullptr != pfnSetTimesliceMode )
        {
            result = pfnSetTimesliceMode( hScheduler, pProperties, pNeedReload );
        }
        else
        {
            // generic implementation
        }

        return result;
    }